

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  if (size == 0) {
    pNVar2 = &dummynode_;
    t->node = &dummynode_;
    iVar6 = 0;
    lVar4 = 0;
    goto LAB_00114c6e;
  }
  iVar1 = luaO_log2(size - 1);
  iVar6 = iVar1 + 1;
  if (iVar1 < 0x1a) {
LAB_00114c01:
    uVar5 = 1 << ((byte)iVar6 & 0x1f);
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,(long)(int)uVar5 * 0x28);
    t->node = pNVar2;
    if (iVar6 != 0x1f) {
      uVar3 = (ulong)uVar5;
      lVar4 = 0x20;
      do {
        pNVar2 = t->node;
        *(undefined8 *)((long)&(pNVar2->i_val).value + lVar4) = 0;
        *(undefined4 *)((long)pNVar2 + lVar4 + -8) = 0;
        *(undefined4 *)((long)pNVar2 + lVar4 + -0x18) = 0;
        lVar4 = lVar4 + 0x28;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      pNVar2 = t->node;
    }
  }
  else {
    luaG_runerror(L,"table overflow");
    if (iVar6 != 0x1f) goto LAB_00114c01;
    pNVar2 = (Node *)luaM_toobig(L);
    t->node = pNVar2;
    uVar5 = 0x80000000;
  }
  lVar4 = (long)(int)uVar5;
LAB_00114c6e:
  t->lsizenode = (lu_byte)iVar6;
  t->lastfree = pNVar2 + lVar4;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, int size) {
  int lsize;
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common `dummynode' */
    lsize = 0;
  }
  else {
    int i;
    lsize = ceillog2(size);
    if (lsize > MAXBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i=0; i<size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = NULL;
      setnilvalue(gkey(n));
      setnilvalue(gval(n));
    }
  }
  t->lsizenode = cast_byte(lsize);
  t->lastfree = gnode(t, size);  /* all positions are free */
}